

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeviceContextBase.cpp
# Opt level: O0

bool Diligent::VerifyBindSparseResourceMemoryAttribs
               (IRenderDevice *pDevice,BindSparseResourceMemoryAttribs *Attribs)

{
  type_conflict tVar1;
  IDeviceMemory *pIVar2;
  ulong uVar3;
  Uint64 UVar4;
  bool bVar5;
  SPARSE_TEXTURE_FLAGS SVar6;
  int iVar7;
  SPARSE_RESOURCE_CAP_FLAGS SVar8;
  uint uVar9;
  type_conflict tVar10;
  Uint32 UVar11;
  undefined4 extraout_var;
  Char *pCVar12;
  undefined4 extraout_var_00;
  SparseBufferMemoryBindInfo *pSVar13;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  SparseTextureMemoryBindInfo *pSVar14;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  SparseTextureMemoryBindRange *pSVar15;
  undefined4 extraout_var_07;
  undefined4 extraout_var_08;
  undefined4 extraout_var_09;
  undefined4 extraout_var_10;
  char (*in_RCX) [96];
  BindSparseResourceMemoryAttribs *Args_1;
  char (*in_R9) [45];
  uint3 uVar16;
  SparseTextureMemoryBindRange *in_stack_fffffffffffff570;
  char *in_stack_fffffffffffff580;
  char *in_stack_fffffffffffff590;
  char *in_stack_fffffffffffff5a0;
  char (*in_stack_fffffffffffff5a8) [10];
  undefined1 local_868 [8];
  string msg_54;
  string msg_53;
  undefined1 local_820 [4];
  Uint32 i_3;
  string msg_52;
  string msg_51;
  string msg_50;
  string msg_49;
  undefined1 local_798 [4];
  Uint32 i_2;
  string msg_48;
  string msg_47;
  string msg_46;
  string msg_45;
  Uint64 PageSize_1;
  string msg_44;
  Uint64 Capacity_1;
  string msg_43;
  string msg_42;
  string msg_41;
  Uint32 NumBlocks;
  uint local_678;
  int local_66c;
  int iStack_668;
  uint3 TilesInBox;
  string msg_40;
  undefined1 local_638 [8];
  string msg_39;
  string msg_38;
  string msg_37;
  string msg_36;
  string msg_35;
  string msg_34;
  undefined1 local_55c [4];
  undefined1 local_558 [8];
  string msg_33;
  undefined1 local_530 [8];
  string msg_32;
  undefined1 local_508 [8];
  string msg_31;
  string msg_30;
  string msg_29;
  string msg_28;
  string msg_27;
  string msg_26;
  string msg_25;
  string msg_24;
  string msg_23;
  string msg_22;
  string msg_21;
  uint local_3a0;
  Uint32 MipDepth;
  Uint32 MipHeight;
  Uint32 MipWidth;
  MipLevelProperties MipProps;
  Box *Region;
  SparseTextureMemoryBindRange *Range_1;
  long lStack_350;
  Uint32 r_1;
  SparseTextureProperties *TexSparseProps;
  string msg_20;
  TextureDesc *Desc_1;
  string msg_19;
  string msg_18;
  string msg_17;
  SparseTextureMemoryBindInfo *Bind_1;
  undefined1 local_2b0 [4];
  Uint32 i_1;
  string msg_16;
  string msg_15;
  Uint64 PageSize;
  string msg_14;
  Uint64 Capacity;
  string msg_13;
  string msg_12;
  string msg_11;
  string msg_10;
  string msg_9;
  SparseBufferMemoryBindRange *Range;
  undefined8 uStack_190;
  Uint32 r;
  undefined8 local_180 [2];
  undefined8 *local_170;
  SparseBufferProperties *BuffSparseProps;
  string msg_8;
  BufferDesc *Desc;
  string msg_7;
  string msg_6;
  string msg_5;
  SparseBufferMemoryBindInfo *Bind;
  Uint32 i;
  bool IsMetal;
  string msg_4;
  string msg_3;
  string msg_2;
  string msg_1;
  undefined1 local_40 [8];
  string msg;
  SparseResourceProperties *SparseRes;
  BindSparseResourceMemoryAttribs *Attribs_local;
  IRenderDevice *pDevice_local;
  
  iVar7 = (*(pDevice->super_IObject)._vptr_IObject[0x19])();
  msg.field_2._8_8_ = CONCAT44(extraout_var,iVar7) + 0x1a0;
  if (Attribs->NumBufferBinds != 0) {
    if (Attribs->pBufferBinds == (SparseBufferMemoryBindInfo *)0x0) {
      FormatString<char[41],char[19],unsigned_int,char[27]>
                ((string *)local_40,(Diligent *)"Bind sparse memory attribs are invalid: ",
                 (char (*) [41])"NumBufferBinds is ",(char (*) [19])&Attribs->NumBufferBinds,
                 (uint *)", but pBufferBinds is null",(char (*) [27])in_R9);
      pCVar12 = (Char *)std::__cxx11::string::c_str();
      in_RCX = (char (*) [96])0x471;
      DebugAssertionFailed
                (pCVar12,"VerifyBindSparseResourceMemoryAttribs",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DeviceContextBase.cpp"
                 ,0x471);
      std::__cxx11::string::~string((string *)local_40);
    }
    SVar8 = operator&(*(SPARSE_RESOURCE_CAP_FLAGS *)(msg.field_2._8_8_ + 0x10),
                      SPARSE_RESOURCE_CAP_FLAG_BUFFER);
    if (SVar8 == SPARSE_RESOURCE_CAP_FLAG_NONE) {
      FormatString<char[41],char[91]>
                ((string *)((long)&msg_2.field_2 + 8),
                 (Diligent *)"Bind sparse memory attribs are invalid: ",
                 (char (*) [41])
                 "NumBufferBinds must be zero if SPARSE_RESOURCE_CAP_FLAG_BUFFER capability is not supported"
                 ,(char (*) [91])in_RCX);
      pCVar12 = (Char *)std::__cxx11::string::c_str();
      in_RCX = (char (*) [96])0x472;
      DebugAssertionFailed
                (pCVar12,"VerifyBindSparseResourceMemoryAttribs",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DeviceContextBase.cpp"
                 ,0x472);
      std::__cxx11::string::~string((string *)(msg_2.field_2._M_local_buf + 8));
    }
  }
  if (Attribs->NumTextureBinds != 0) {
    if (Attribs->pTextureBinds == (SparseTextureMemoryBindInfo *)0x0) {
      FormatString<char[41],char[20],unsigned_int,char[28]>
                ((string *)((long)&msg_3.field_2 + 8),
                 (Diligent *)"Bind sparse memory attribs are invalid: ",
                 (char (*) [41])"NumTextureBinds is ",(char (*) [20])&Attribs->NumTextureBinds,
                 (uint *)", but pTextureBinds is null",(char (*) [28])in_R9);
      pCVar12 = (Char *)std::__cxx11::string::c_str();
      in_RCX = (char (*) [96])0x476;
      DebugAssertionFailed
                (pCVar12,"VerifyBindSparseResourceMemoryAttribs",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DeviceContextBase.cpp"
                 ,0x476);
      std::__cxx11::string::~string((string *)(msg_3.field_2._M_local_buf + 8));
    }
    SVar8 = operator&(*(SPARSE_RESOURCE_CAP_FLAGS *)(msg.field_2._8_8_ + 0x10),
                      SPARSE_RESOURCE_CAP_FLAG_TEXTURE_2D);
    if (SVar8 == SPARSE_RESOURCE_CAP_FLAG_NONE) {
      FormatString<char[41],char[96]>
                ((string *)((long)&msg_4.field_2 + 8),
                 (Diligent *)"Bind sparse memory attribs are invalid: ",
                 (char (*) [41])
                 "NumTextureBinds must be zero if SPARSE_RESOURCE_CAP_FLAG_TEXTURE_2D capability is not supported"
                 ,in_RCX);
      pCVar12 = (Char *)std::__cxx11::string::c_str();
      in_RCX = (char (*) [96])0x477;
      DebugAssertionFailed
                (pCVar12,"VerifyBindSparseResourceMemoryAttribs",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DeviceContextBase.cpp"
                 ,0x477);
      std::__cxx11::string::~string((string *)(msg_4.field_2._M_local_buf + 8));
    }
  }
  if ((Attribs->NumBufferBinds == 0) && (Attribs->NumTextureBinds == 0)) {
    FormatString<char[41],char[59]>
              ((string *)&i,(Diligent *)"Bind sparse memory attribs are invalid: ",
               (char (*) [41])"One of NumBufferBinds and NumTextureBinds must not be zero",
               (char (*) [59])in_RCX);
    pCVar12 = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (pCVar12,"VerifyBindSparseResourceMemoryAttribs",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DeviceContextBase.cpp"
               ,0x47a);
    std::__cxx11::string::~string((string *)&i);
  }
  iVar7 = (*(pDevice->super_IObject)._vptr_IObject[0x18])();
  Bind._7_1_ = RenderDeviceInfo::IsMetalDevice((RenderDeviceInfo *)CONCAT44(extraout_var_00,iVar7));
  for (Bind._0_4_ = 0; (uint)Bind < Attribs->NumBufferBinds; Bind._0_4_ = (uint)Bind + 1) {
    pSVar13 = Attribs->pBufferBinds + (uint)Bind;
    if (pSVar13->pBuffer == (IBuffer *)0x0) {
      FormatString<char[41],char[14],unsigned_int,char[27]>
                ((string *)((long)&msg_6.field_2 + 8),
                 (Diligent *)"Bind sparse memory attribs are invalid: ",
                 (char (*) [41])"pBufferBinds[",(char (*) [14])&Bind,
                 (uint *)"].pBuffer must not be null",(char (*) [27])in_R9);
      pCVar12 = (Char *)std::__cxx11::string::c_str();
      DebugAssertionFailed
                (pCVar12,"VerifyBindSparseResourceMemoryAttribs",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DeviceContextBase.cpp"
                 ,0x482);
      std::__cxx11::string::~string((string *)(msg_6.field_2._M_local_buf + 8));
    }
    if (pSVar13->NumRanges == 0) {
      FormatString<char[41],char[14],unsigned_int,char[29]>
                ((string *)((long)&msg_7.field_2 + 8),
                 (Diligent *)"Bind sparse memory attribs are invalid: ",
                 (char (*) [41])"pBufferBinds[",(char (*) [14])&Bind,
                 (uint *)"].NumRanges must not be zero",(char (*) [29])in_R9);
      pCVar12 = (Char *)std::__cxx11::string::c_str();
      DebugAssertionFailed
                (pCVar12,"VerifyBindSparseResourceMemoryAttribs",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DeviceContextBase.cpp"
                 ,0x483);
      std::__cxx11::string::~string((string *)(msg_7.field_2._M_local_buf + 8));
    }
    if (pSVar13->pRanges == (SparseBufferMemoryBindRange *)0x0) {
      FormatString<char[41],char[14],unsigned_int,char[27]>
                ((string *)&Desc,(Diligent *)"Bind sparse memory attribs are invalid: ",
                 (char (*) [41])"pBufferBinds[",(char (*) [14])&Bind,
                 (uint *)"].pRanges must not be null",(char (*) [27])in_R9);
      pCVar12 = (Char *)std::__cxx11::string::c_str();
      DebugAssertionFailed
                (pCVar12,"VerifyBindSparseResourceMemoryAttribs",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DeviceContextBase.cpp"
                 ,0x484);
      std::__cxx11::string::~string((string *)&Desc);
    }
    if (pSVar13->pBuffer != (IBuffer *)0x0) {
      iVar7 = (*(pSVar13->pBuffer->super_IDeviceObject).super_IObject._vptr_IObject[4])();
      msg_8.field_2._8_8_ = CONCAT44(extraout_var_01,iVar7);
      if (*(char *)(msg_8.field_2._8_8_ + 0x14) != '\x05') {
        FormatString<char[41],char[14],unsigned_int,char[44]>
                  ((string *)&BuffSparseProps,(Diligent *)"Bind sparse memory attribs are invalid: "
                   ,(char (*) [41])"pBufferBinds[",(char (*) [14])&Bind,
                   (uint *)"].pBuffer must be created with USAGE_SPARSE",(char (*) [44])in_R9);
        pCVar12 = (Char *)std::__cxx11::string::c_str();
        DebugAssertionFailed
                  (pCVar12,"VerifyBindSparseResourceMemoryAttribs",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DeviceContextBase.cpp"
                   ,0x48a);
        std::__cxx11::string::~string((string *)&BuffSparseProps);
      }
      if (pSVar13->pRanges != (SparseBufferMemoryBindRange *)0x0) {
        iVar7 = (*(pSVar13->pBuffer->super_IDeviceObject).super_IObject._vptr_IObject[0x10])();
        uStack_190 = CONCAT44(extraout_var_02,iVar7);
        local_170 = local_180;
        local_180[0] = uStack_190;
        for (Range._4_4_ = 0; Range._4_4_ < pSVar13->NumRanges; Range._4_4_ = Range._4_4_ + 1) {
          pSVar15 = (SparseTextureMemoryBindRange *)(pSVar13->pRanges + Range._4_4_);
          if (*(ulong *)(msg_8.field_2._8_8_ + 8) <
              *(long *)pSVar15 + *(Uint64 *)&(pSVar15->Region).MinY) {
            in_stack_fffffffffffff580 = (char *)&(pSVar15->Region).MinY;
            in_stack_fffffffffffff590 = (char *)(msg_8.field_2._8_8_ + 8);
            in_R9 = (char (*) [45])((long)&Range + 4);
            in_stack_fffffffffffff570 = pSVar15;
            FormatString<char[41],char[14],unsigned_int,char[11],unsigned_int,char[33],unsigned_long,char[11],unsigned_long,char[32],unsigned_long,char[2]>
                      ((string *)((long)&msg_10.field_2 + 8),
                       (Diligent *)"Bind sparse memory attribs are invalid: ",
                       (char (*) [41])"pBufferBinds[",(char (*) [14])&Bind,(uint *)"].pRanges[",
                       (char (*) [11])in_R9,(uint *)"] specifies a range with offset ",
                       (char (*) [33])pSVar15,(unsigned_long *)" and size ",
                       (char (*) [11])in_stack_fffffffffffff580,
                       (unsigned_long *)" that exceeds the buffer size (",
                       (char (*) [32])in_stack_fffffffffffff590,(unsigned_long *)0xcabce5,
                       (char (*) [2])in_stack_fffffffffffff5a0);
            pCVar12 = (Char *)std::__cxx11::string::c_str();
            DebugAssertionFailed
                      (pCVar12,"VerifyBindSparseResourceMemoryAttribs",
                       "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DeviceContextBase.cpp"
                       ,0x495);
            std::__cxx11::string::~string((string *)(msg_10.field_2._M_local_buf + 8));
          }
          if (*(ulong *)pSVar15 % (ulong)*(uint *)(local_170 + 1) != 0) {
            in_stack_fffffffffffff580 = (char *)(local_170 + 1);
            in_R9 = (char (*) [45])((long)&Range + 4);
            in_stack_fffffffffffff570 = pSVar15;
            FormatString<char[41],char[14],unsigned_int,char[11],unsigned_int,char[17],unsigned_long,char[48],unsigned_int,char[2]>
                      ((string *)((long)&msg_11.field_2 + 8),
                       (Diligent *)"Bind sparse memory attribs are invalid: ",
                       (char (*) [41])"pBufferBinds[",(char (*) [14])&Bind,(uint *)"].pRanges[",
                       (char (*) [11])in_R9,(uint *)"].BufferOffset (",(char (*) [17])pSVar15,
                       (unsigned_long *)") must be a multiple of the buffer block size (",
                       (char (*) [48])in_stack_fffffffffffff580,(uint *)0xcabce5,
                       (char (*) [2])in_stack_fffffffffffff590);
            pCVar12 = (Char *)std::__cxx11::string::c_str();
            DebugAssertionFailed
                      (pCVar12,"VerifyBindSparseResourceMemoryAttribs",
                       "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DeviceContextBase.cpp"
                       ,0x498);
            std::__cxx11::string::~string((string *)(msg_11.field_2._M_local_buf + 8));
          }
          if (*(Uint64 *)&(pSVar15->Region).MinY == 0) {
            in_R9 = (char (*) [45])((long)&Range + 4);
            FormatString<char[41],char[14],unsigned_int,char[11],unsigned_int,char[30]>
                      ((string *)((long)&msg_12.field_2 + 8),
                       (Diligent *)"Bind sparse memory attribs are invalid: ",
                       (char (*) [41])"pBufferBinds[",(char (*) [14])&Bind,(uint *)"].pRanges[",
                       (char (*) [11])in_R9,(uint *)"].MemorySize must not be zero",
                       (char (*) [30])in_stack_fffffffffffff570);
            pCVar12 = (Char *)std::__cxx11::string::c_str();
            DebugAssertionFailed
                      (pCVar12,"VerifyBindSparseResourceMemoryAttribs",
                       "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DeviceContextBase.cpp"
                       ,0x49b);
            std::__cxx11::string::~string((string *)(msg_12.field_2._M_local_buf + 8));
          }
          if (*(ulong *)&(pSVar15->Region).MinY % (ulong)*(uint *)(local_170 + 1) != 0) {
            in_stack_fffffffffffff570 = (SparseTextureMemoryBindRange *)(local_170 + 1);
            in_R9 = (char (*) [45])((long)&Range + 4);
            FormatString<char[41],char[14],unsigned_int,char[11],unsigned_int,char[59],unsigned_int,char[2]>
                      ((string *)((long)&msg_13.field_2 + 8),
                       (Diligent *)"Bind sparse memory attribs are invalid: ",
                       (char (*) [41])"pBufferBinds[",(char (*) [14])&Bind,(uint *)"].pRanges[",
                       (char (*) [11])in_R9,
                       (uint *)"].MemorySize must be a multiple of the buffer block size (",
                       (char (*) [59])in_stack_fffffffffffff570,(uint *)0xcabce5,
                       (char (*) [2])in_stack_fffffffffffff580);
            pCVar12 = (Char *)std::__cxx11::string::c_str();
            DebugAssertionFailed
                      (pCVar12,"VerifyBindSparseResourceMemoryAttribs",
                       "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DeviceContextBase.cpp"
                       ,0x49d);
            std::__cxx11::string::~string((string *)(msg_13.field_2._M_local_buf + 8));
          }
          if (*(IDeviceMemory **)&(pSVar15->Region).MinZ == (IDeviceMemory *)0x0) {
            UVar4._0_4_ = (pSVar15->Region).MinX;
            UVar4._4_4_ = (pSVar15->Region).MaxX;
            if (UVar4 != 0) {
              in_R9 = (char (*) [45])((long)&Range + 4);
              FormatString<char[41],char[14],unsigned_int,char[11],unsigned_int,char[52]>
                        ((string *)local_2b0,(Diligent *)"Bind sparse memory attribs are invalid: ",
                         (char (*) [41])"pBufferBinds[",(char (*) [14])&Bind,(uint *)"].pRanges[",
                         (char (*) [11])in_R9,
                         (uint *)"]: if pMemory is null, but MemoryOffset is not zero",
                         (char (*) [52])in_stack_fffffffffffff570);
              pCVar12 = (Char *)std::__cxx11::string::c_str();
              DebugAssertionFailed
                        (pCVar12,"VerifyBindSparseResourceMemoryAttribs",
                         "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DeviceContextBase.cpp"
                         ,0x4b4);
              std::__cxx11::string::~string((string *)local_2b0);
            }
          }
          else {
            pIVar2 = *(IDeviceMemory **)&(pSVar15->Region).MinZ;
            uVar9 = (*(pIVar2->super_IDeviceObject).super_IObject._vptr_IObject[10])
                              (pIVar2,pSVar13->pBuffer);
            if ((uVar9 & 1) == 0) {
              in_R9 = (char (*) [45])((long)&Range + 4);
              FormatString<char[41],char[14],unsigned_int,char[11],unsigned_int,char[42]>
                        ((string *)&Capacity,(Diligent *)"Bind sparse memory attribs are invalid: ",
                         (char (*) [41])"pBufferBinds[",(char (*) [14])&Bind,(uint *)"].pRanges[",
                         (char (*) [11])in_R9,(uint *)"].pMemory must be compatible with pBuffer",
                         (char (*) [42])in_stack_fffffffffffff570);
              pCVar12 = (Char *)std::__cxx11::string::c_str();
              DebugAssertionFailed
                        (pCVar12,"VerifyBindSparseResourceMemoryAttribs",
                         "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DeviceContextBase.cpp"
                         ,0x4a2);
              std::__cxx11::string::~string((string *)&Capacity);
            }
            iVar7 = (*((*(IDeviceMemory **)&(pSVar15->Region).MinZ)->super_IDeviceObject).
                      super_IObject._vptr_IObject[9])();
            msg_14.field_2._8_8_ = CONCAT44(extraout_var_03,iVar7);
            if ((ulong)msg_14.field_2._8_8_ <
                *(Uint64 *)&pSVar15->Region + *(Uint64 *)&(pSVar15->Region).MinY) {
              in_stack_fffffffffffff570 = (SparseTextureMemoryBindRange *)&pSVar15->Region;
              in_stack_fffffffffffff580 = (char *)&(pSVar15->Region).MinY;
              in_stack_fffffffffffff590 = (char *)((long)&msg_14.field_2 + 8);
              in_R9 = (char (*) [45])((long)&Range + 4);
              FormatString<char[41],char[14],unsigned_int,char[11],unsigned_int,char[33],unsigned_long,char[11],unsigned_long,char[39],unsigned_long,char[2]>
                        ((string *)&PageSize,(Diligent *)"Bind sparse memory attribs are invalid: ",
                         (char (*) [41])"pBufferBinds[",(char (*) [14])&Bind,(uint *)"].pRanges[",
                         (char (*) [11])in_R9,(uint *)"] specifies a range with offset ",
                         (char (*) [33])in_stack_fffffffffffff570,(unsigned_long *)" and size ",
                         (char (*) [11])in_stack_fffffffffffff580,
                         (unsigned_long *)" that exceeds the device memory size (",
                         (char (*) [39])in_stack_fffffffffffff590,(unsigned_long *)0xcabce5,
                         (char (*) [2])in_stack_fffffffffffff5a0);
              pCVar12 = (Char *)std::__cxx11::string::c_str();
              DebugAssertionFailed
                        (pCVar12,"VerifyBindSparseResourceMemoryAttribs",
                         "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DeviceContextBase.cpp"
                         ,0x4a7);
              std::__cxx11::string::~string((string *)&PageSize);
            }
            iVar7 = (*((*(IDeviceMemory **)&(pSVar15->Region).MinZ)->super_IDeviceObject).
                      super_IObject._vptr_IObject[4])();
            uVar3 = *(ulong *)(CONCAT44(extraout_var_04,iVar7) + 0x10);
            if (uVar3 < *(ulong *)&pSVar15->Region % uVar3 + *(Uint64 *)&(pSVar15->Region).MinY) {
              in_stack_fffffffffffff570 = (SparseTextureMemoryBindRange *)&pSVar15->Region;
              in_stack_fffffffffffff580 = (char *)&(pSVar15->Region).MinY;
              in_R9 = (char (*) [45])((long)&Range + 4);
              FormatString<char[41],char[14],unsigned_int,char[11],unsigned_int,char[33],unsigned_long,char[11],unsigned_long,char[86]>
                        ((string *)((long)&msg_16.field_2 + 8),
                         (Diligent *)"Bind sparse memory attribs are invalid: ",
                         (char (*) [41])"pBufferBinds[",(char (*) [14])&Bind,(uint *)"].pRanges[",
                         (char (*) [11])in_R9,(uint *)"] specifies a range with offset ",
                         (char (*) [33])in_stack_fffffffffffff570,(unsigned_long *)" and size ",
                         (char (*) [11])in_stack_fffffffffffff580,
                         (unsigned_long *)
                         " that does not fit into a single page. in Direct3D12 and Vulkan this will be an error"
                         ,(char (*) [86])in_stack_fffffffffffff590);
              pCVar12 = (Char *)std::__cxx11::string::c_str();
              DebugAssertionFailed
                        (pCVar12,"VerifyBindSparseResourceMemoryAttribs",
                         "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DeviceContextBase.cpp"
                         ,0x4af);
              std::__cxx11::string::~string((string *)(msg_16.field_2._M_local_buf + 8));
            }
          }
        }
      }
    }
  }
  for (Bind_1._4_4_ = 0; Bind_1._4_4_ < Attribs->NumTextureBinds; Bind_1._4_4_ = Bind_1._4_4_ + 1) {
    pSVar14 = Attribs->pTextureBinds + Bind_1._4_4_;
    if (pSVar14->pTexture == (ITexture *)0x0) {
      FormatString<char[41],char[15],unsigned_int,char[28]>
                ((string *)((long)&msg_18.field_2 + 8),
                 (Diligent *)"Bind sparse memory attribs are invalid: ",
                 (char (*) [41])"pTextureBinds[",(char (*) [15])((long)&Bind_1 + 4),
                 (uint *)"].pTexture must not be null",(char (*) [28])in_R9);
      pCVar12 = (Char *)std::__cxx11::string::c_str();
      DebugAssertionFailed
                (pCVar12,"VerifyBindSparseResourceMemoryAttribs",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DeviceContextBase.cpp"
                 ,0x4bc);
      std::__cxx11::string::~string((string *)(msg_18.field_2._M_local_buf + 8));
    }
    if (pSVar14->NumRanges == 0) {
      FormatString<char[41],char[15],unsigned_int,char[29]>
                ((string *)((long)&msg_19.field_2 + 8),
                 (Diligent *)"Bind sparse memory attribs are invalid: ",
                 (char (*) [41])"pTextureBinds[",(char (*) [15])((long)&Bind_1 + 4),
                 (uint *)"].NumRanges must not be zero",(char (*) [29])in_R9);
      pCVar12 = (Char *)std::__cxx11::string::c_str();
      DebugAssertionFailed
                (pCVar12,"VerifyBindSparseResourceMemoryAttribs",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DeviceContextBase.cpp"
                 ,0x4bd);
      std::__cxx11::string::~string((string *)(msg_19.field_2._M_local_buf + 8));
    }
    if (pSVar14->pRanges == (SparseTextureMemoryBindRange *)0x0) {
      FormatString<char[41],char[15],unsigned_int,char[27]>
                ((string *)&Desc_1,(Diligent *)"Bind sparse memory attribs are invalid: ",
                 (char (*) [41])"pTextureBinds[",(char (*) [15])((long)&Bind_1 + 4),
                 (uint *)"].pRanges must not be null",(char (*) [27])in_R9);
      pCVar12 = (Char *)std::__cxx11::string::c_str();
      DebugAssertionFailed
                (pCVar12,"VerifyBindSparseResourceMemoryAttribs",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DeviceContextBase.cpp"
                 ,0x4be);
      std::__cxx11::string::~string((string *)&Desc_1);
    }
    if (pSVar14->pTexture != (ITexture *)0x0) {
      iVar7 = (*(pSVar14->pTexture->super_IDeviceObject).super_IObject._vptr_IObject[4])();
      msg_20.field_2._8_8_ = CONCAT44(extraout_var_05,iVar7);
      if (*(char *)(msg_20.field_2._8_8_ + 0x28) != '\x05') {
        FormatString<char[41],char[15],unsigned_int,char[45]>
                  ((string *)&TexSparseProps,(Diligent *)"Bind sparse memory attribs are invalid: ",
                   (char (*) [41])"pTextureBinds[",(char (*) [15])((long)&Bind_1 + 4),
                   (uint *)"].pTexture must be created with USAGE_SPARSE",in_R9);
        pCVar12 = (Char *)std::__cxx11::string::c_str();
        DebugAssertionFailed
                  (pCVar12,"VerifyBindSparseResourceMemoryAttribs",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DeviceContextBase.cpp"
                   ,0x4c4);
        std::__cxx11::string::~string((string *)&TexSparseProps);
      }
      if (pSVar14->pRanges != (SparseTextureMemoryBindRange *)0x0) {
        iVar7 = (*(pSVar14->pTexture->super_IDeviceObject).super_IObject._vptr_IObject[0xd])();
        lStack_350 = CONCAT44(extraout_var_06,iVar7);
        for (Range_1._4_4_ = 0; Range_1._4_4_ < pSVar14->NumRanges;
            Range_1._4_4_ = Range_1._4_4_ + 1) {
          pSVar15 = pSVar14->pRanges + Range_1._4_4_;
          MipProps.MipSize = (Uint64)&pSVar15->Region;
          GetMipLevelProperties
                    ((MipLevelProperties *)&MipHeight,(TextureDesc *)msg_20.field_2._8_8_,
                     (Uint32)*(Uint64 *)&pSVar15->MipLevel);
          MipDepth = MipProps.LogicalWidth;
          local_3a0 = MipProps.LogicalHeight;
          msg_21.field_2._12_4_ = MipProps.StorageWidth;
          if (*(uint *)(msg_20.field_2._8_8_ + 0x1c) <= (uint)*(Uint64 *)&pSVar15->MipLevel) {
            in_stack_fffffffffffff580 = (char *)(msg_20.field_2._8_8_ + 0x1c);
            in_R9 = (char (*) [45])((long)&Range_1 + 4);
            in_stack_fffffffffffff570 = pSVar15;
            FormatString<char[41],char[15],unsigned_int,char[11],unsigned_int,char[13],unsigned_int,char[42],unsigned_int,char[3]>
                      ((string *)((long)&msg_22.field_2 + 8),
                       (Diligent *)"Bind sparse memory attribs are invalid: ",
                       (char (*) [41])"pTextureBinds[",(char (*) [15])((long)&Bind_1 + 4),
                       (uint *)"].pRanges[",(char (*) [11])in_R9,(uint *)"].MipLevel (",
                       (char (*) [13])pSVar15,(uint *)") must be less than the mip level count (",
                       (char (*) [42])in_stack_fffffffffffff580,(uint *)0xccce78,
                       (char (*) [3])in_stack_fffffffffffff590);
            pCVar12 = (Char *)std::__cxx11::string::c_str();
            DebugAssertionFailed
                      (pCVar12,"VerifyBindSparseResourceMemoryAttribs",
                       "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DeviceContextBase.cpp"
                       ,0x4d5);
            std::__cxx11::string::~string((string *)(msg_22.field_2._M_local_buf + 8));
          }
          if (*(uint *)(lStack_350 + 0x20) < (uint)*(Uint64 *)&pSVar15->MipLevel) {
            in_stack_fffffffffffff580 = (char *)(lStack_350 + 0x20);
            in_R9 = (char (*) [45])((long)&Range_1 + 4);
            in_stack_fffffffffffff570 = pSVar15;
            FormatString<char[41],char[15],unsigned_int,char[11],unsigned_int,char[13],unsigned_int,char[42],unsigned_int,char[2]>
                      ((string *)((long)&msg_23.field_2 + 8),
                       (Diligent *)"Bind sparse memory attribs are invalid: ",
                       (char (*) [41])"pTextureBinds[",(char (*) [15])((long)&Bind_1 + 4),
                       (uint *)"].pRanges[",(char (*) [11])in_R9,(uint *)"].MipLevel (",
                       (char (*) [13])pSVar15,(uint *)") must not exceed the first mip in tail (",
                       (char (*) [42])in_stack_fffffffffffff580,(uint *)0xcabce5,
                       (char (*) [2])in_stack_fffffffffffff590);
            pCVar12 = (Char *)std::__cxx11::string::c_str();
            DebugAssertionFailed
                      (pCVar12,"VerifyBindSparseResourceMemoryAttribs",
                       "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DeviceContextBase.cpp"
                       ,0x4d8);
            std::__cxx11::string::~string((string *)(msg_23.field_2._M_local_buf + 8));
          }
          UVar4 = MipProps.MipSize;
          if ((uint)*(Uint64 *)&pSVar15->MipLevel < *(uint *)(lStack_350 + 0x20)) {
            if (pSVar15->OffsetInMipTail != 0) {
              in_R9 = (char (*) [45])((long)&Range_1 + 4);
              FormatString<char[41],char[15],unsigned_int,char[11],unsigned_int,char[69]>
                        ((string *)((long)&msg_24.field_2 + 8),
                         (Diligent *)"Bind sparse memory attribs are invalid: ",
                         (char (*) [41])"pTextureBinds[",(char (*) [15])((long)&Bind_1 + 4),
                         (uint *)"].pRanges[",(char (*) [11])in_R9,
                         (uint *)
                         "].OffsetInMipTail must be zero when Range.MipLevel is not a tail mip",
                         (char (*) [69])in_stack_fffffffffffff570);
              pCVar12 = (Char *)std::__cxx11::string::c_str();
              DebugAssertionFailed
                        (pCVar12,"VerifyBindSparseResourceMemoryAttribs",
                         "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DeviceContextBase.cpp"
                         ,0x4dd);
              std::__cxx11::string::~string((string *)(msg_24.field_2._M_local_buf + 8));
            }
            bVar5 = Box::IsValid((Box *)MipProps.MipSize);
            if (!bVar5) {
              in_R9 = (char (*) [45])((long)&Range_1 + 4);
              FormatString<char[41],char[15],unsigned_int,char[11],unsigned_int,char[23]>
                        ((string *)((long)&msg_25.field_2 + 8),
                         (Diligent *)"Bind sparse memory attribs are invalid: ",
                         (char (*) [41])"pTextureBinds[",(char (*) [15])((long)&Bind_1 + 4),
                         (uint *)"].pRanges[",(char (*) [11])in_R9,(uint *)"].Region must be valid",
                         (char (*) [23])in_stack_fffffffffffff570);
              pCVar12 = (Char *)std::__cxx11::string::c_str();
              DebugAssertionFailed
                        (pCVar12,"VerifyBindSparseResourceMemoryAttribs",
                         "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DeviceContextBase.cpp"
                         ,0x4df);
              std::__cxx11::string::~string((string *)(msg_25.field_2._M_local_buf + 8));
            }
            if ((MipDepth < *(uint *)(MipProps.MipSize + 4)) &&
               (tVar1 = *(type_conflict *)(MipProps.MipSize + 4),
               tVar10 = AlignUp<unsigned_int,unsigned_int>(MipDepth,*(uint *)(lStack_350 + 0x24)),
               tVar1 != tVar10)) {
              in_stack_fffffffffffff570 = (SparseTextureMemoryBindRange *)(MipProps.MipSize + 4);
              in_stack_fffffffffffff580 = (char *)&MipDepth;
              in_R9 = (char (*) [45])((long)&Range_1 + 4);
              FormatString<char[41],char[15],unsigned_int,char[11],unsigned_int,char[16],unsigned_int,char[40],unsigned_int,char[2]>
                        ((string *)((long)&msg_26.field_2 + 8),
                         (Diligent *)"Bind sparse memory attribs are invalid: ",
                         (char (*) [41])"pTextureBinds[",(char (*) [15])((long)&Bind_1 + 4),
                         (uint *)"].pRanges[",(char (*) [11])in_R9,(uint *)"].Region.MaxX (",
                         (char (*) [16])in_stack_fffffffffffff570,
                         (uint *)") must not exceed the mip level width (",
                         (char (*) [40])in_stack_fffffffffffff580,(uint *)0xcabce5,
                         (char (*) [2])in_stack_fffffffffffff590);
              pCVar12 = (Char *)std::__cxx11::string::c_str();
              DebugAssertionFailed
                        (pCVar12,"VerifyBindSparseResourceMemoryAttribs",
                         "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DeviceContextBase.cpp"
                         ,0x4e1);
              std::__cxx11::string::~string((string *)(msg_26.field_2._M_local_buf + 8));
            }
            if ((local_3a0 < *(uint *)(MipProps.MipSize + 0xc)) &&
               (tVar1 = *(type_conflict *)(MipProps.MipSize + 0xc),
               tVar10 = AlignUp<unsigned_int,unsigned_int>(local_3a0,*(uint *)(lStack_350 + 0x28)),
               tVar1 != tVar10)) {
              in_stack_fffffffffffff570 = (SparseTextureMemoryBindRange *)(MipProps.MipSize + 0xc);
              in_stack_fffffffffffff580 = (char *)&stack0xfffffffffffffc60;
              in_R9 = (char (*) [45])((long)&Range_1 + 4);
              FormatString<char[41],char[15],unsigned_int,char[11],unsigned_int,char[16],unsigned_int,char[41],unsigned_int,char[2]>
                        ((string *)((long)&msg_27.field_2 + 8),
                         (Diligent *)"Bind sparse memory attribs are invalid: ",
                         (char (*) [41])"pTextureBinds[",(char (*) [15])((long)&Bind_1 + 4),
                         (uint *)"].pRanges[",(char (*) [11])in_R9,(uint *)"].Region.MaxY (",
                         (char (*) [16])in_stack_fffffffffffff570,
                         (uint *)") must not exceed the mip level height (",
                         (char (*) [41])in_stack_fffffffffffff580,(uint *)0xcabce5,
                         (char (*) [2])in_stack_fffffffffffff590);
              pCVar12 = (Char *)std::__cxx11::string::c_str();
              DebugAssertionFailed
                        (pCVar12,"VerifyBindSparseResourceMemoryAttribs",
                         "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DeviceContextBase.cpp"
                         ,0x4e3);
              std::__cxx11::string::~string((string *)(msg_27.field_2._M_local_buf + 8));
            }
            if (((uint)msg_21.field_2._12_4_ < *(uint *)(MipProps.MipSize + 0x14)) &&
               (tVar1 = *(type_conflict *)(MipProps.MipSize + 0x14),
               tVar10 = AlignUp<unsigned_int,unsigned_int>
                                  (msg_21.field_2._12_4_,*(uint *)(lStack_350 + 0x2c)),
               tVar1 != tVar10)) {
              in_stack_fffffffffffff570 = (SparseTextureMemoryBindRange *)(MipProps.MipSize + 0x14);
              in_stack_fffffffffffff580 = (char *)((long)&msg_21.field_2 + 0xc);
              in_R9 = (char (*) [45])((long)&Range_1 + 4);
              FormatString<char[41],char[15],unsigned_int,char[11],unsigned_int,char[16],unsigned_int,char[40],unsigned_int,char[2]>
                        ((string *)((long)&msg_28.field_2 + 8),
                         (Diligent *)"Bind sparse memory attribs are invalid: ",
                         (char (*) [41])"pTextureBinds[",(char (*) [15])((long)&Bind_1 + 4),
                         (uint *)"].pRanges[",(char (*) [11])in_R9,(uint *)"].Region.MaxZ (",
                         (char (*) [16])in_stack_fffffffffffff570,
                         (uint *)") must not exceed the mip level depth (",
                         (char (*) [40])in_stack_fffffffffffff580,(uint *)0xcabce5,
                         (char (*) [2])in_stack_fffffffffffff590);
              pCVar12 = (Char *)std::__cxx11::string::c_str();
              DebugAssertionFailed
                        (pCVar12,"VerifyBindSparseResourceMemoryAttribs",
                         "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DeviceContextBase.cpp"
                         ,0x4e5);
              std::__cxx11::string::~string((string *)(msg_28.field_2._M_local_buf + 8));
            }
            if (*(uint *)MipProps.MipSize % *(uint *)(lStack_350 + 0x24) != 0) {
              in_stack_fffffffffffff580 = (char *)(lStack_350 + 0x24);
              in_R9 = (char (*) [45])((long)&Range_1 + 4);
              in_stack_fffffffffffff570 = (SparseTextureMemoryBindRange *)MipProps.MipSize;
              FormatString<char[41],char[15],unsigned_int,char[11],unsigned_int,char[16],unsigned_int,char[41],unsigned_int,char[2]>
                        ((string *)((long)&msg_29.field_2 + 8),
                         (Diligent *)"Bind sparse memory attribs are invalid: ",
                         (char (*) [41])"pTextureBinds[",(char (*) [15])((long)&Bind_1 + 4),
                         (uint *)"].pRanges[",(char (*) [11])in_R9,(uint *)"].Region.MinX (",
                         (char (*) [16])MipProps.MipSize,
                         (uint *)") must be a multiple of the tile width (",
                         (char (*) [41])in_stack_fffffffffffff580,(uint *)0xcabce5,
                         (char (*) [2])in_stack_fffffffffffff590);
              pCVar12 = (Char *)std::__cxx11::string::c_str();
              DebugAssertionFailed
                        (pCVar12,"VerifyBindSparseResourceMemoryAttribs",
                         "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DeviceContextBase.cpp"
                         ,0x4e8);
              std::__cxx11::string::~string((string *)(msg_29.field_2._M_local_buf + 8));
            }
            if (*(uint *)(MipProps.MipSize + 8) % *(uint *)(lStack_350 + 0x28) != 0) {
              in_stack_fffffffffffff570 = (SparseTextureMemoryBindRange *)(MipProps.MipSize + 8);
              in_stack_fffffffffffff580 = (char *)(lStack_350 + 0x28);
              in_R9 = (char (*) [45])((long)&Range_1 + 4);
              FormatString<char[41],char[15],unsigned_int,char[11],unsigned_int,char[16],unsigned_int,char[42],unsigned_int,char[2]>
                        ((string *)((long)&msg_30.field_2 + 8),
                         (Diligent *)"Bind sparse memory attribs are invalid: ",
                         (char (*) [41])"pTextureBinds[",(char (*) [15])((long)&Bind_1 + 4),
                         (uint *)"].pRanges[",(char (*) [11])in_R9,(uint *)"].Region.MinY (",
                         (char (*) [16])in_stack_fffffffffffff570,
                         (uint *)") must be a multiple of the tile height (",
                         (char (*) [42])in_stack_fffffffffffff580,(uint *)0xcabce5,
                         (char (*) [2])in_stack_fffffffffffff590);
              pCVar12 = (Char *)std::__cxx11::string::c_str();
              DebugAssertionFailed
                        (pCVar12,"VerifyBindSparseResourceMemoryAttribs",
                         "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DeviceContextBase.cpp"
                         ,0x4ea);
              std::__cxx11::string::~string((string *)(msg_30.field_2._M_local_buf + 8));
            }
            if (*(uint *)(MipProps.MipSize + 0x10) % *(uint *)(lStack_350 + 0x2c) != 0) {
              in_stack_fffffffffffff570 = (SparseTextureMemoryBindRange *)(MipProps.MipSize + 0x10);
              in_stack_fffffffffffff580 = (char *)(lStack_350 + 0x2c);
              in_R9 = (char (*) [45])((long)&Range_1 + 4);
              FormatString<char[41],char[15],unsigned_int,char[11],unsigned_int,char[16],unsigned_int,char[41],unsigned_int,char[2]>
                        ((string *)((long)&msg_31.field_2 + 8),
                         (Diligent *)"Bind sparse memory attribs are invalid: ",
                         (char (*) [41])"pTextureBinds[",(char (*) [15])((long)&Bind_1 + 4),
                         (uint *)"].pRanges[",(char (*) [11])in_R9,(uint *)"].Region.MinZ (",
                         (char (*) [16])in_stack_fffffffffffff570,
                         (uint *)") must be a multiple of the tile depth (",
                         (char (*) [41])in_stack_fffffffffffff580,(uint *)0xcabce5,
                         (char (*) [2])in_stack_fffffffffffff590);
              pCVar12 = (Char *)std::__cxx11::string::c_str();
              DebugAssertionFailed
                        (pCVar12,"VerifyBindSparseResourceMemoryAttribs",
                         "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DeviceContextBase.cpp"
                         ,0x4ec);
              std::__cxx11::string::~string((string *)(msg_31.field_2._M_local_buf + 8));
            }
            UVar11 = Box::Width((Box *)MipProps.MipSize);
            if ((UVar11 % *(uint *)(lStack_350 + 0x24) != 0) &&
               (*(Uint32 *)(MipProps.MipSize + 4) != MipDepth)) {
              msg_32.field_2._12_4_ = Box::Width((Box *)MipProps.MipSize);
              in_stack_fffffffffffff580 = (char *)(lStack_350 + 0x24);
              in_stack_fffffffffffff570 =
                   (SparseTextureMemoryBindRange *)((long)&msg_32.field_2 + 0xc);
              in_R9 = (char (*) [45])((long)&Range_1 + 4);
              FormatString<char[41],char[15],unsigned_int,char[11],unsigned_int,char[17],unsigned_int,char[41],unsigned_int,char[2]>
                        ((string *)local_508,(Diligent *)"Bind sparse memory attribs are invalid: ",
                         (char (*) [41])"pTextureBinds[",(char (*) [15])((long)&Bind_1 + 4),
                         (uint *)"].pRanges[",(char (*) [11])in_R9,(uint *)"].Region width (",
                         (char (*) [17])in_stack_fffffffffffff570,
                         (uint *)") must be a multiple of the tile width (",
                         (char (*) [41])in_stack_fffffffffffff580,(uint *)0xcabce5,
                         (char (*) [2])in_stack_fffffffffffff590);
              pCVar12 = (Char *)std::__cxx11::string::c_str();
              DebugAssertionFailed
                        (pCVar12,"VerifyBindSparseResourceMemoryAttribs",
                         "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DeviceContextBase.cpp"
                         ,0x4ee);
              std::__cxx11::string::~string((string *)local_508);
            }
            UVar11 = Box::Height((Box *)MipProps.MipSize);
            if ((UVar11 % *(uint *)(lStack_350 + 0x28) != 0) &&
               (*(uint *)(MipProps.MipSize + 0xc) != local_3a0)) {
              msg_33.field_2._12_4_ = Box::Height((Box *)MipProps.MipSize);
              in_stack_fffffffffffff580 = (char *)(lStack_350 + 0x28);
              in_stack_fffffffffffff570 =
                   (SparseTextureMemoryBindRange *)((long)&msg_33.field_2 + 0xc);
              in_R9 = (char (*) [45])((long)&Range_1 + 4);
              FormatString<char[41],char[15],unsigned_int,char[11],unsigned_int,char[18],unsigned_int,char[40],unsigned_int,char[2]>
                        ((string *)local_530,(Diligent *)"Bind sparse memory attribs are invalid: ",
                         (char (*) [41])"pTextureBinds[",(char (*) [15])((long)&Bind_1 + 4),
                         (uint *)"].pRanges[",(char (*) [11])in_R9,(uint *)"].Region height (",
                         (char (*) [18])in_stack_fffffffffffff570,
                         (uint *)") must be multiple of the tile height (",
                         (char (*) [40])in_stack_fffffffffffff580,(uint *)0xcabce5,
                         (char (*) [2])in_stack_fffffffffffff590);
              pCVar12 = (Char *)std::__cxx11::string::c_str();
              DebugAssertionFailed
                        (pCVar12,"VerifyBindSparseResourceMemoryAttribs",
                         "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DeviceContextBase.cpp"
                         ,0x4f0);
              std::__cxx11::string::~string((string *)local_530);
            }
            UVar11 = Box::Depth((Box *)MipProps.MipSize);
            if ((UVar11 % *(uint *)(lStack_350 + 0x2c) != 0) &&
               (*(int *)(MipProps.MipSize + 0x14) != msg_21.field_2._12_4_)) {
              local_55c = (undefined1  [4])Box::Depth((Box *)MipProps.MipSize);
              in_stack_fffffffffffff580 = (char *)(lStack_350 + 0x2c);
              in_stack_fffffffffffff570 = (SparseTextureMemoryBindRange *)local_55c;
              in_R9 = (char (*) [45])((long)&Range_1 + 4);
              FormatString<char[41],char[15],unsigned_int,char[11],unsigned_int,char[17],unsigned_int,char[41],unsigned_int,char[2]>
                        ((string *)local_558,(Diligent *)"Bind sparse memory attribs are invalid: ",
                         (char (*) [41])"pTextureBinds[",(char (*) [15])((long)&Bind_1 + 4),
                         (uint *)"].pRanges[",(char (*) [11])in_R9,(uint *)"].Region depth (",
                         (char (*) [17])in_stack_fffffffffffff570,
                         (uint *)") must be a multiple of the tile depth (",
                         (char (*) [41])in_stack_fffffffffffff580,(uint *)0xcabce5,
                         (char (*) [2])in_stack_fffffffffffff590);
              pCVar12 = (Char *)std::__cxx11::string::c_str();
              DebugAssertionFailed
                        (pCVar12,"VerifyBindSparseResourceMemoryAttribs",
                         "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DeviceContextBase.cpp"
                         ,0x4f2);
              std::__cxx11::string::~string((string *)local_558);
            }
          }
          else {
            Box::Box((Box *)((long)&msg_34.field_2 + 0xc));
            bVar5 = Box::operator==((Box *)UVar4,(Box *)((long)&msg_34.field_2 + 0xc));
            if (((bVar5 ^ 0xffU) & 1) != 0) {
              in_R9 = (char (*) [45])((long)&Range_1 + 4);
              FormatString<char[41],char[15],unsigned_int,char[11],unsigned_int,char[59]>
                        ((string *)((long)&msg_35.field_2 + 8),
                         (Diligent *)"Bind sparse memory attribs are invalid: ",
                         (char (*) [41])"pTextureBinds[",(char (*) [15])((long)&Bind_1 + 4),
                         (uint *)"].pRanges[",(char (*) [11])in_R9,
                         (uint *)"].Region must be default when Range.MipLevel is a tail mip",
                         (char (*) [59])in_stack_fffffffffffff570);
              pCVar12 = (Char *)std::__cxx11::string::c_str();
              DebugAssertionFailed
                        (pCVar12,"VerifyBindSparseResourceMemoryAttribs",
                         "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DeviceContextBase.cpp"
                         ,0x4f7);
              std::__cxx11::string::~string((string *)(msg_35.field_2._M_local_buf + 8));
            }
            if (*(ulong *)(lStack_350 + 0x18) < pSVar15->OffsetInMipTail + pSVar15->MemorySize) {
              in_stack_fffffffffffff570 = (SparseTextureMemoryBindRange *)&pSVar15->OffsetInMipTail;
              in_stack_fffffffffffff580 = (char *)&pSVar15->MemorySize;
              in_stack_fffffffffffff590 = (char *)(lStack_350 + 0x18);
              in_R9 = (char (*) [45])((long)&Range_1 + 4);
              FormatString<char[41],char[15],unsigned_int,char[11],unsigned_int,char[30],unsigned_long,char[19],unsigned_long,char[34],unsigned_long,char[2]>
                        ((string *)((long)&msg_36.field_2 + 8),
                         (Diligent *)"Bind sparse memory attribs are invalid: ",
                         (char (*) [41])"pTextureBinds[",(char (*) [15])((long)&Bind_1 + 4),
                         (uint *)"].pRanges[",(char (*) [11])in_R9,
                         (uint *)"] specifies OffsetInMipTail (",
                         (char (*) [30])in_stack_fffffffffffff570,
                         (unsigned_long *)") and MemorySize (",
                         (char (*) [19])in_stack_fffffffffffff580,
                         (unsigned_long *)") that exceed the mip tail size (",
                         (char (*) [34])in_stack_fffffffffffff590,(unsigned_long *)0xcabce5,
                         (char (*) [2])in_stack_fffffffffffff5a0);
              pCVar12 = (Char *)std::__cxx11::string::c_str();
              DebugAssertionFailed
                        (pCVar12,"VerifyBindSparseResourceMemoryAttribs",
                         "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DeviceContextBase.cpp"
                         ,0x4fa);
              std::__cxx11::string::~string((string *)(msg_36.field_2._M_local_buf + 8));
            }
            if (pSVar15->OffsetInMipTail % (ulong)*(uint *)(lStack_350 + 0x30) != 0) {
              in_stack_fffffffffffff570 = (SparseTextureMemoryBindRange *)&pSVar15->OffsetInMipTail;
              in_stack_fffffffffffff580 = (char *)(lStack_350 + 0x30);
              in_R9 = (char (*) [45])((long)&Range_1 + 4);
              FormatString<char[41],char[15],unsigned_int,char[11],unsigned_int,char[20],unsigned_long,char[49],unsigned_int,char[2]>
                        ((string *)((long)&msg_37.field_2 + 8),
                         (Diligent *)"Bind sparse memory attribs are invalid: ",
                         (char (*) [41])"pTextureBinds[",(char (*) [15])((long)&Bind_1 + 4),
                         (uint *)"].pRanges[",(char (*) [11])in_R9,(uint *)"].OffsetInMipTail (",
                         (char (*) [20])in_stack_fffffffffffff570,
                         (unsigned_long *)") must be a multiple of the texture block size (",
                         (char (*) [49])in_stack_fffffffffffff580,(uint *)0xcabce5,
                         (char (*) [2])in_stack_fffffffffffff590);
              pCVar12 = (Char *)std::__cxx11::string::c_str();
              DebugAssertionFailed
                        (pCVar12,"VerifyBindSparseResourceMemoryAttribs",
                         "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DeviceContextBase.cpp"
                         ,0x4fd);
              std::__cxx11::string::~string((string *)(msg_37.field_2._M_local_buf + 8));
            }
            SVar6 = operator&(*(SPARSE_TEXTURE_FLAGS *)(lStack_350 + 0x34),
                              SPARSE_TEXTURE_FLAG_SINGLE_MIPTAIL);
            if ((SVar6 != SPARSE_TEXTURE_FLAG_NONE) && (pSVar15->ArraySlice != 0)) {
              in_stack_fffffffffffff570 = (SparseTextureMemoryBindRange *)&pSVar15->ArraySlice;
              in_R9 = (char (*) [45])((long)&Range_1 + 4);
              FormatString<char[41],char[15],unsigned_int,char[11],unsigned_int,char[15],unsigned_int,char[34]>
                        ((string *)((long)&msg_38.field_2 + 8),
                         (Diligent *)"Bind sparse memory attribs are invalid: ",
                         (char (*) [41])"pTextureBinds[",(char (*) [15])((long)&Bind_1 + 4),
                         (uint *)"].pRanges[",(char (*) [11])in_R9,(uint *)"].ArraySlice (",
                         (char (*) [15])in_stack_fffffffffffff570,
                         (uint *)") must be 0 for a single mip tail",
                         (char (*) [34])in_stack_fffffffffffff580);
              pCVar12 = (Char *)std::__cxx11::string::c_str();
              DebugAssertionFailed
                        (pCVar12,"VerifyBindSparseResourceMemoryAttribs",
                         "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DeviceContextBase.cpp"
                         ,0x502);
              std::__cxx11::string::~string((string *)(msg_38.field_2._M_local_buf + 8));
            }
            if (((Bind._7_1_ & 1) != 0) &&
               ((pSVar15->OffsetInMipTail != 0 ||
                ((pSVar15->MemorySize != 0 &&
                 (pSVar15->MemorySize != *(Uint64 *)(lStack_350 + 0x18))))))) {
              in_stack_fffffffffffff5a0 = ") or zero";
              in_stack_fffffffffffff590 = ") must be equal to the mip tail size (";
              in_stack_fffffffffffff580 = ") must be zero and MemorySize (";
              in_stack_fffffffffffff570 = (SparseTextureMemoryBindRange *)0xcc4d5c;
              in_R9 = (char (*) [45])((long)&Range_1 + 4);
              FormatString<char[41],char[15],unsigned_int,char[11],unsigned_int,char[63],char[18],unsigned_long,char[32],unsigned_long,char[39],unsigned_long,char[10]>
                        ((string *)((long)&msg_39.field_2 + 8),
                         (Diligent *)"Bind sparse memory attribs are invalid: ",
                         (char (*) [41])"pTextureBinds[",(char (*) [15])((long)&Bind_1 + 4),
                         (uint *)"].pRanges[",(char (*) [11])in_R9,
                         (uint *)"]: in Metal, mip tail must be bound in a single memory range: ",
                         (char (*) [63])0xcc4d5c,(char (*) [18])&pSVar15->OffsetInMipTail,
                         (unsigned_long *)") must be zero and MemorySize (",
                         (char (*) [32])&pSVar15->MemorySize,
                         (unsigned_long *)") must be equal to the mip tail size (",
                         (char (*) [39])(lStack_350 + 0x18),(unsigned_long *)") or zero",
                         in_stack_fffffffffffff5a8);
              pCVar12 = (Char *)std::__cxx11::string::c_str();
              DebugAssertionFailed
                        (pCVar12,"VerifyBindSparseResourceMemoryAttribs",
                         "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DeviceContextBase.cpp"
                         ,0x50a);
              std::__cxx11::string::~string((string *)(msg_39.field_2._M_local_buf + 8));
            }
          }
          uVar9 = pSVar15->ArraySlice;
          UVar11 = TextureDesc::GetArraySize((TextureDesc *)msg_20.field_2._8_8_);
          if (UVar11 <= uVar9) {
            in_stack_fffffffffffff570 = (SparseTextureMemoryBindRange *)&pSVar15->ArraySlice;
            msg_40.field_2._12_4_ = TextureDesc::GetArraySize((TextureDesc *)msg_20.field_2._8_8_);
            in_stack_fffffffffffff580 = (char *)((long)&msg_40.field_2 + 0xc);
            in_R9 = (char (*) [45])((long)&Range_1 + 4);
            FormatString<char[41],char[15],unsigned_int,char[11],unsigned_int,char[15],unsigned_int,char[37],unsigned_int,char[2]>
                      ((string *)local_638,(Diligent *)"Bind sparse memory attribs are invalid: ",
                       (char (*) [41])"pTextureBinds[",(char (*) [15])((long)&Bind_1 + 4),
                       (uint *)"].pRanges[",(char (*) [11])in_R9,(uint *)"].ArraySlice (",
                       (char (*) [15])in_stack_fffffffffffff570,
                       (uint *)") must be less than the array size (",
                       (char (*) [37])in_stack_fffffffffffff580,(uint *)0xcabce5,
                       (char (*) [2])in_stack_fffffffffffff590);
            pCVar12 = (Char *)std::__cxx11::string::c_str();
            DebugAssertionFailed
                      (pCVar12,"VerifyBindSparseResourceMemoryAttribs",
                       "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DeviceContextBase.cpp"
                       ,0x50f);
            std::__cxx11::string::~string((string *)local_638);
          }
          if (pSVar15->MemorySize % (ulong)*(uint *)(lStack_350 + 0x30) != 0) {
            in_stack_fffffffffffff570 = (SparseTextureMemoryBindRange *)&pSVar15->MemorySize;
            in_stack_fffffffffffff580 = (char *)(lStack_350 + 0x30);
            in_R9 = (char (*) [45])((long)&Range_1 + 4);
            FormatString<char[41],char[15],unsigned_int,char[11],unsigned_int,char[15],unsigned_long,char[49],unsigned_int,char[2]>
                      ((string *)((long)&TilesInBox.field_0 + 4),
                       (Diligent *)"Bind sparse memory attribs are invalid: ",
                       (char (*) [41])"pTextureBinds[",(char (*) [15])((long)&Bind_1 + 4),
                       (uint *)"].pRanges[",(char (*) [11])in_R9,(uint *)"].MemorySize (",
                       (char (*) [15])in_stack_fffffffffffff570,
                       (unsigned_long *)") must be a multiple of the texture block size (",
                       (char (*) [49])in_stack_fffffffffffff580,(uint *)0xcabce5,
                       (char (*) [2])in_stack_fffffffffffff590);
            pCVar12 = (Char *)std::__cxx11::string::c_str();
            DebugAssertionFailed
                      (pCVar12,"VerifyBindSparseResourceMemoryAttribs",
                       "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DeviceContextBase.cpp"
                       ,0x514);
            std::__cxx11::string::~string((string *)((long)&TilesInBox.field_0 + 4));
          }
          if ((Bind._7_1_ & 1) == 0) {
            if ((pSVar15->MemorySize != 0) &&
               ((uint)*(Uint64 *)&pSVar15->MipLevel < *(uint *)(lStack_350 + 0x20))) {
              uVar16 = GetNumSparseTilesInBox((Box *)MipProps.MipSize,(Uint32 *)(lStack_350 + 0x24))
              ;
              local_678 = uVar16.field_0._8_4_;
              TilesInBox.field_0.field_0.x = local_678;
              local_66c = uVar16.field_0._0_4_;
              iStack_668 = uVar16.field_0._4_4_;
              msg_41.field_2._12_4_ = local_66c * iStack_668 * local_678;
              if ((ulong)(uint)msg_41.field_2._12_4_ * (ulong)*(uint *)(lStack_350 + 0x30) -
                  pSVar15->MemorySize != 0) {
                in_stack_fffffffffffff570 = (SparseTextureMemoryBindRange *)&pSVar15->MemorySize;
                in_stack_fffffffffffff580 = (char *)((long)&msg_41.field_2 + 0xc);
                in_R9 = (char (*) [45])((long)&Range_1 + 4);
                FormatString<char[41],char[15],unsigned_int,char[11],unsigned_int,char[15],unsigned_long,char[50],unsigned_int,char[26]>
                          ((string *)((long)&msg_42.field_2 + 8),
                           (Diligent *)"Bind sparse memory attribs are invalid: ",
                           (char (*) [41])"pTextureBinds[",(char (*) [15])((long)&Bind_1 + 4),
                           (uint *)"].pRanges[",(char (*) [11])in_R9,(uint *)"].MemorySize (",
                           (char (*) [15])in_stack_fffffffffffff570,
                           (unsigned_long *)") does not match the sparse memory blocks count (",
                           (char (*) [50])in_stack_fffffffffffff580,
                           (uint *)") in the specified region",
                           (char (*) [26])in_stack_fffffffffffff590);
                pCVar12 = (Char *)std::__cxx11::string::c_str();
                DebugAssertionFailed
                          (pCVar12,"VerifyBindSparseResourceMemoryAttribs",
                           "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DeviceContextBase.cpp"
                           ,0x51f);
                std::__cxx11::string::~string((string *)(msg_42.field_2._M_local_buf + 8));
              }
            }
            if (((int)*(Uint64 *)&pSVar15->MipLevel == *(int *)(lStack_350 + 0x20)) &&
               (pSVar15->MemorySize == 0)) {
              in_R9 = (char (*) [45])((long)&Range_1 + 4);
              FormatString<char[41],char[15],unsigned_int,char[11],unsigned_int,char[30]>
                        ((string *)((long)&msg_43.field_2 + 8),
                         (Diligent *)"Bind sparse memory attribs are invalid: ",
                         (char (*) [41])"pTextureBinds[",(char (*) [15])((long)&Bind_1 + 4),
                         (uint *)"].pRanges[",(char (*) [11])in_R9,
                         (uint *)"].MemorySize must not be zero",
                         (char (*) [30])in_stack_fffffffffffff570);
              pCVar12 = (Char *)std::__cxx11::string::c_str();
              DebugAssertionFailed
                        (pCVar12,"VerifyBindSparseResourceMemoryAttribs",
                         "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DeviceContextBase.cpp"
                         ,0x527);
              std::__cxx11::string::~string((string *)(msg_43.field_2._M_local_buf + 8));
            }
            if (pSVar15->pMemory != (IDeviceMemory *)0x0) {
              uVar9 = (*(pSVar15->pMemory->super_IDeviceObject).super_IObject._vptr_IObject[10])
                                (pSVar15->pMemory,pSVar14->pTexture);
              if ((uVar9 & 1) == 0) {
                in_R9 = (char (*) [45])((long)&Range_1 + 4);
                FormatString<char[41],char[15],unsigned_int,char[11],unsigned_int,char[43]>
                          ((string *)&Capacity_1,
                           (Diligent *)"Bind sparse memory attribs are invalid: ",
                           (char (*) [41])"pTextureBinds[",(char (*) [15])((long)&Bind_1 + 4),
                           (uint *)"].pRanges[",(char (*) [11])in_R9,
                           (uint *)"].pMemory must be compatible with pTexture",
                           (char (*) [43])in_stack_fffffffffffff570);
                pCVar12 = (Char *)std::__cxx11::string::c_str();
                DebugAssertionFailed
                          (pCVar12,"VerifyBindSparseResourceMemoryAttribs",
                           "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DeviceContextBase.cpp"
                           ,0x52d);
                std::__cxx11::string::~string((string *)&Capacity_1);
              }
              iVar7 = (*(pSVar15->pMemory->super_IDeviceObject).super_IObject._vptr_IObject[9])();
              msg_44.field_2._8_8_ = CONCAT44(extraout_var_07,iVar7);
              if ((ulong)msg_44.field_2._8_8_ < pSVar15->MemoryOffset + pSVar15->MemorySize) {
                in_stack_fffffffffffff570 = (SparseTextureMemoryBindRange *)&pSVar15->MemoryOffset;
                in_stack_fffffffffffff580 = (char *)&pSVar15->MemorySize;
                in_stack_fffffffffffff590 = (char *)((long)&msg_44.field_2 + 8);
                in_R9 = (char (*) [45])((long)&Range_1 + 4);
                FormatString<char[41],char[15],unsigned_int,char[11],unsigned_int,char[27],unsigned_long,char[19],unsigned_long,char[36],unsigned_long,char[2]>
                          ((string *)&PageSize_1,
                           (Diligent *)"Bind sparse memory attribs are invalid: ",
                           (char (*) [41])"pTextureBinds[",(char (*) [15])((long)&Bind_1 + 4),
                           (uint *)"].pRanges[",(char (*) [11])in_R9,
                           (uint *)"] specifies MemoryOffset (",
                           (char (*) [27])in_stack_fffffffffffff570,
                           (unsigned_long *)") and MemorySize (",
                           (char (*) [19])in_stack_fffffffffffff580,
                           (unsigned_long *)") that exceed the memory capacity (",
                           (char (*) [36])in_stack_fffffffffffff590,(unsigned_long *)0xcabce5,
                           (char (*) [2])in_stack_fffffffffffff5a0);
                pCVar12 = (Char *)std::__cxx11::string::c_str();
                DebugAssertionFailed
                          (pCVar12,"VerifyBindSparseResourceMemoryAttribs",
                           "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DeviceContextBase.cpp"
                           ,0x532);
                std::__cxx11::string::~string((string *)&PageSize_1);
              }
              iVar7 = (*(pSVar15->pMemory->super_IDeviceObject).super_IObject._vptr_IObject[4])();
              uVar3 = *(ulong *)(CONCAT44(extraout_var_08,iVar7) + 0x10);
              if (uVar3 < pSVar15->MemoryOffset % uVar3 + pSVar15->MemorySize) {
                in_stack_fffffffffffff570 = (SparseTextureMemoryBindRange *)&pSVar15->MemoryOffset;
                in_stack_fffffffffffff580 = (char *)&pSVar15->MemorySize;
                in_R9 = (char (*) [45])((long)&Range_1 + 4);
                FormatString<char[41],char[15],unsigned_int,char[11],unsigned_int,char[27],unsigned_long,char[19],unsigned_long,char[84]>
                          ((string *)((long)&msg_46.field_2 + 8),
                           (Diligent *)"Bind sparse memory attribs are invalid: ",
                           (char (*) [41])"pTextureBinds[",(char (*) [15])((long)&Bind_1 + 4),
                           (uint *)"].pRanges[",(char (*) [11])in_R9,
                           (uint *)"] specifies MemoryOffset (",
                           (char (*) [27])in_stack_fffffffffffff570,
                           (unsigned_long *)") and MemorySize (",
                           (char (*) [19])in_stack_fffffffffffff580,
                           (unsigned_long *)
                           ") that don\'t fit into a single page. In Direct3D12 and Vulkan this will be an error"
                           ,(char (*) [84])in_stack_fffffffffffff590);
                pCVar12 = (Char *)std::__cxx11::string::c_str();
                DebugAssertionFailed
                          (pCVar12,"VerifyBindSparseResourceMemoryAttribs",
                           "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DeviceContextBase.cpp"
                           ,0x539);
                std::__cxx11::string::~string((string *)(msg_46.field_2._M_local_buf + 8));
              }
            }
          }
          if ((pSVar15->pMemory == (IDeviceMemory *)0x0) && (pSVar15->MemoryOffset != 0)) {
            in_R9 = (char (*) [45])((long)&Range_1 + 4);
            FormatString<char[41],char[15],unsigned_int,char[11],unsigned_int,char[49]>
                      ((string *)((long)&msg_47.field_2 + 8),
                       (Diligent *)"Bind sparse memory attribs are invalid: ",
                       (char (*) [41])"pTextureBinds[",(char (*) [15])((long)&Bind_1 + 4),
                       (uint *)"].pRanges[",(char (*) [11])in_R9,
                       (uint *)"]: pMemory is null, but MemoryOffset is not zero",
                       (char (*) [49])in_stack_fffffffffffff570);
            pCVar12 = (Char *)std::__cxx11::string::c_str();
            DebugAssertionFailed
                      (pCVar12,"VerifyBindSparseResourceMemoryAttribs",
                       "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DeviceContextBase.cpp"
                       ,0x540);
            std::__cxx11::string::~string((string *)(msg_47.field_2._M_local_buf + 8));
          }
        }
      }
    }
  }
  Args_1 = Attribs;
  if (Attribs->NumWaitFences != 0) {
    if (Attribs->ppWaitFences == (IFence **)0x0) {
      FormatString<char[41],char[59]>
                ((string *)((long)&msg_48.field_2 + 8),
                 (Diligent *)"Bind sparse memory attribs are invalid: ",
                 (char (*) [41])"ppWaitFences must not be null if NumWaitFences is not zero",
                 (char (*) [59])Attribs);
      pCVar12 = (Char *)std::__cxx11::string::c_str();
      Args_1 = (BindSparseResourceMemoryAttribs *)0x548;
      DebugAssertionFailed
                (pCVar12,"VerifyBindSparseResourceMemoryAttribs",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DeviceContextBase.cpp"
                 ,0x548);
      std::__cxx11::string::~string((string *)(msg_48.field_2._M_local_buf + 8));
    }
    if (Attribs->pWaitFenceValues == (Uint64 *)0x0) {
      FormatString<char[41],char[63]>
                ((string *)local_798,(Diligent *)"Bind sparse memory attribs are invalid: ",
                 (char (*) [41])"pWaitFenceValues must not be null if NumWaitFences is not zero",
                 (char (*) [63])Args_1);
      pCVar12 = (Char *)std::__cxx11::string::c_str();
      Args_1 = (BindSparseResourceMemoryAttribs *)0x549;
      DebugAssertionFailed
                (pCVar12,"VerifyBindSparseResourceMemoryAttribs",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DeviceContextBase.cpp"
                 ,0x549);
      std::__cxx11::string::~string((string *)local_798);
    }
    if (Attribs->pWaitFenceValues != (Uint64 *)0x0) {
      for (msg_49.field_2._12_4_ = 0; Args_1 = Attribs,
          (uint)msg_49.field_2._12_4_ < Attribs->NumWaitFences;
          msg_49.field_2._12_4_ = msg_49.field_2._12_4_ + 1) {
        if (Attribs->ppWaitFences[(uint)msg_49.field_2._12_4_] == (IFence *)0x0) {
          FormatString<char[41],char[14],unsigned_int,char[19]>
                    ((string *)((long)&msg_50.field_2 + 8),
                     (Diligent *)"Bind sparse memory attribs are invalid: ",
                     (char (*) [41])"ppWaitFences[",(char (*) [14])((long)&msg_49.field_2 + 0xc),
                     (uint *)"] must not be null",(char (*) [19])in_R9);
          pCVar12 = (Char *)std::__cxx11::string::c_str();
          DebugAssertionFailed
                    (pCVar12,"VerifyBindSparseResourceMemoryAttribs",
                     "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DeviceContextBase.cpp"
                     ,0x54f);
          std::__cxx11::string::~string((string *)(msg_50.field_2._M_local_buf + 8));
        }
        iVar7 = (*(Attribs->ppWaitFences[(uint)msg_49.field_2._12_4_]->super_IDeviceObject).
                  super_IObject._vptr_IObject[4])();
        if (*(char *)(CONCAT44(extraout_var_09,iVar7) + 8) != '\x01') {
          FormatString<char[41],char[14],unsigned_int,char[23]>
                    ((string *)((long)&msg_51.field_2 + 8),
                     (Diligent *)"Bind sparse memory attribs are invalid: ",
                     (char (*) [41])"ppWaitFences[",(char (*) [14])((long)&msg_49.field_2 + 0xc),
                     (uint *)"] must be GENERAL type",(char (*) [23])in_R9);
          pCVar12 = (Char *)std::__cxx11::string::c_str();
          DebugAssertionFailed
                    (pCVar12,"VerifyBindSparseResourceMemoryAttribs",
                     "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DeviceContextBase.cpp"
                     ,0x550);
          std::__cxx11::string::~string((string *)(msg_51.field_2._M_local_buf + 8));
        }
      }
    }
  }
  if (Attribs->NumSignalFences != 0) {
    if (Attribs->ppSignalFences == (IFence **)0x0) {
      FormatString<char[41],char[63]>
                ((string *)((long)&msg_52.field_2 + 8),
                 (Diligent *)"Bind sparse memory attribs are invalid: ",
                 (char (*) [41])"ppSignalFences must not be null if NumSignalFences is not zero",
                 (char (*) [63])Args_1);
      pCVar12 = (Char *)std::__cxx11::string::c_str();
      Args_1 = (BindSparseResourceMemoryAttribs *)0x557;
      DebugAssertionFailed
                (pCVar12,"VerifyBindSparseResourceMemoryAttribs",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DeviceContextBase.cpp"
                 ,0x557);
      std::__cxx11::string::~string((string *)(msg_52.field_2._M_local_buf + 8));
    }
    if (Attribs->pSignalFenceValues == (Uint64 *)0x0) {
      FormatString<char[41],char[67]>
                ((string *)local_820,(Diligent *)"Bind sparse memory attribs are invalid: ",
                 (char (*) [41])"pSignalFenceValues must not be null if NumSignalFences is not zero"
                 ,(char (*) [67])Args_1);
      pCVar12 = (Char *)std::__cxx11::string::c_str();
      DebugAssertionFailed
                (pCVar12,"VerifyBindSparseResourceMemoryAttribs",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DeviceContextBase.cpp"
                 ,0x558);
      std::__cxx11::string::~string((string *)local_820);
    }
    if (Attribs->pSignalFenceValues != (Uint64 *)0x0) {
      for (msg_53.field_2._12_4_ = 0; (uint)msg_53.field_2._12_4_ < Attribs->NumSignalFences;
          msg_53.field_2._12_4_ = msg_53.field_2._12_4_ + 1) {
        if (Attribs->ppSignalFences[(uint)msg_53.field_2._12_4_] == (IFence *)0x0) {
          FormatString<char[41],char[16],unsigned_int,char[19]>
                    ((string *)((long)&msg_54.field_2 + 8),
                     (Diligent *)"Bind sparse memory attribs are invalid: ",
                     (char (*) [41])"ppSignalFences[",(char (*) [16])((long)&msg_53.field_2 + 0xc),
                     (uint *)"] must not be null",(char (*) [19])in_R9);
          pCVar12 = (Char *)std::__cxx11::string::c_str();
          DebugAssertionFailed
                    (pCVar12,"VerifyBindSparseResourceMemoryAttribs",
                     "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DeviceContextBase.cpp"
                     ,0x55e);
          std::__cxx11::string::~string((string *)(msg_54.field_2._M_local_buf + 8));
        }
        iVar7 = (*(Attribs->ppSignalFences[(uint)msg_53.field_2._12_4_]->super_IDeviceObject).
                  super_IObject._vptr_IObject[4])();
        if (*(char *)(CONCAT44(extraout_var_10,iVar7) + 8) != '\x01') {
          FormatString<char[41],char[16],unsigned_int,char[23]>
                    ((string *)local_868,(Diligent *)"Bind sparse memory attribs are invalid: ",
                     (char (*) [41])"ppSignalFences[",(char (*) [16])((long)&msg_53.field_2 + 0xc),
                     (uint *)"] must be GENERAL type",(char (*) [23])in_R9);
          pCVar12 = (Char *)std::__cxx11::string::c_str();
          DebugAssertionFailed
                    (pCVar12,"VerifyBindSparseResourceMemoryAttribs",
                     "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DeviceContextBase.cpp"
                     ,0x55f);
          std::__cxx11::string::~string((string *)local_868);
        }
      }
    }
  }
  return true;
}

Assistant:

bool VerifyBindSparseResourceMemoryAttribs(const IRenderDevice* pDevice, const BindSparseResourceMemoryAttribs& Attribs)
{
#define CHECK_BIND_SPARSE_ATTRIBS(Expr, ...) CHECK_PARAMETER(Expr, "Bind sparse memory attribs are invalid: ", __VA_ARGS__)

    const SparseResourceProperties& SparseRes = pDevice->GetAdapterInfo().SparseResources;

    if (Attribs.NumBufferBinds != 0)
    {
        CHECK_BIND_SPARSE_ATTRIBS(Attribs.pBufferBinds != nullptr, "NumBufferBinds is ", Attribs.NumBufferBinds, ", but pBufferBinds is null");
        CHECK_BIND_SPARSE_ATTRIBS((SparseRes.CapFlags & SPARSE_RESOURCE_CAP_FLAG_BUFFER) != 0, "NumBufferBinds must be zero if SPARSE_RESOURCE_CAP_FLAG_BUFFER capability is not supported");
    }
    if (Attribs.NumTextureBinds != 0)
    {
        CHECK_BIND_SPARSE_ATTRIBS(Attribs.pTextureBinds != nullptr, "NumTextureBinds is ", Attribs.NumTextureBinds, ", but pTextureBinds is null");
        CHECK_BIND_SPARSE_ATTRIBS((SparseRes.CapFlags & SPARSE_RESOURCE_CAP_FLAG_TEXTURE_2D) != 0, "NumTextureBinds must be zero if SPARSE_RESOURCE_CAP_FLAG_TEXTURE_2D capability is not supported");
    }

    CHECK_BIND_SPARSE_ATTRIBS(Attribs.NumBufferBinds > 0 || Attribs.NumTextureBinds > 0, "One of NumBufferBinds and NumTextureBinds must not be zero");

#ifdef DILIGENT_DEVELOPMENT
    const bool IsMetal = pDevice->GetDeviceInfo().IsMetalDevice();

    for (Uint32 i = 0; i < Attribs.NumBufferBinds; ++i)
    {
        const SparseBufferMemoryBindInfo& Bind = Attribs.pBufferBinds[i];
        CHECK_BIND_SPARSE_ATTRIBS(Bind.pBuffer != nullptr, "pBufferBinds[", i, "].pBuffer must not be null");
        CHECK_BIND_SPARSE_ATTRIBS(Bind.NumRanges != 0, "pBufferBinds[", i, "].NumRanges must not be zero");
        CHECK_BIND_SPARSE_ATTRIBS(Bind.pRanges != nullptr, "pBufferBinds[", i, "].pRanges must not be null");

        if (Bind.pBuffer == nullptr)
            continue;

        const BufferDesc& Desc = Bind.pBuffer->GetDesc();
        CHECK_BIND_SPARSE_ATTRIBS(Desc.Usage == USAGE_SPARSE, "pBufferBinds[", i, "].pBuffer must be created with USAGE_SPARSE");

        if (Bind.pRanges == nullptr)
            continue;

        const SparseBufferProperties& BuffSparseProps = Bind.pBuffer->GetSparseProperties();
        for (Uint32 r = 0; r < Bind.NumRanges; ++r)
        {
            const SparseBufferMemoryBindRange& Range = Bind.pRanges[r];
            CHECK_BIND_SPARSE_ATTRIBS(Range.BufferOffset + Range.MemorySize <= Desc.Size,
                                      "pBufferBinds[", i, "].pRanges[", r, "] specifies a range with offset ", Range.BufferOffset, " and size ",
                                      Range.MemorySize, " that exceeds the buffer size (", Desc.Size, ")");
            CHECK_BIND_SPARSE_ATTRIBS(Range.BufferOffset % BuffSparseProps.BlockSize == 0,
                                      "pBufferBinds[", i, "].pRanges[", r, "].BufferOffset (", Range.BufferOffset,
                                      ") must be a multiple of the buffer block size (", BuffSparseProps.BlockSize, ")");

            CHECK_BIND_SPARSE_ATTRIBS(Range.MemorySize != 0,
                                      "pBufferBinds[", i, "].pRanges[", r, "].MemorySize must not be zero");
            CHECK_BIND_SPARSE_ATTRIBS(Range.MemorySize % BuffSparseProps.BlockSize == 0,
                                      "pBufferBinds[", i, "].pRanges[", r, "].MemorySize must be a multiple of the buffer block size (", BuffSparseProps.BlockSize, ")");

            if (Range.pMemory != nullptr)
            {
                CHECK_BIND_SPARSE_ATTRIBS(Range.pMemory->IsCompatible(Bind.pBuffer),
                                          "pBufferBinds[", i, "].pRanges[", r, "].pMemory must be compatible with pBuffer");

                const Uint64 Capacity = Range.pMemory->GetCapacity();
                CHECK_BIND_SPARSE_ATTRIBS(Range.MemoryOffset + Range.MemorySize <= Capacity,
                                          "pBufferBinds[", i, "].pRanges[", r, "] specifies a range with offset ", Range.MemoryOffset,
                                          " and size ", Range.MemorySize, " that exceeds the device memory size (", Capacity, ")");
                // Can not check here because final memory offset depends on the device memory object implementation
                //CHECK_BIND_SPARSE_ATTRIBS(Range.MemoryOffset % BuffSparseProps.BlockSize == 0)

                const Uint64 PageSize = Range.pMemory->GetDesc().PageSize;
                CHECK_BIND_SPARSE_ATTRIBS((Range.MemoryOffset % PageSize) + Range.MemorySize <= PageSize,
                                          "pBufferBinds[", i, "].pRanges[", r, "] specifies a range with offset ", Range.MemoryOffset,
                                          " and size ", Range.MemorySize,
                                          " that does not fit into a single page. in Direct3D12 and Vulkan this will be an error");
            }
            else
            {
                CHECK_BIND_SPARSE_ATTRIBS(Range.MemoryOffset == 0,
                                          "pBufferBinds[", i, "].pRanges[", r, "]: if pMemory is null, but MemoryOffset is not zero");
            }
        }
    }

    for (Uint32 i = 0; i < Attribs.NumTextureBinds; ++i)
    {
        const SparseTextureMemoryBindInfo& Bind = Attribs.pTextureBinds[i];
        CHECK_BIND_SPARSE_ATTRIBS(Bind.pTexture != nullptr, "pTextureBinds[", i, "].pTexture must not be null");
        CHECK_BIND_SPARSE_ATTRIBS(Bind.NumRanges != 0, "pTextureBinds[", i, "].NumRanges must not be zero");
        CHECK_BIND_SPARSE_ATTRIBS(Bind.pRanges != nullptr, "pTextureBinds[", i, "].pRanges must not be null");

        if (Bind.pTexture == nullptr)
            continue;

        const TextureDesc& Desc = Bind.pTexture->GetDesc();
        CHECK_BIND_SPARSE_ATTRIBS(Desc.Usage == USAGE_SPARSE, "pTextureBinds[", i, "].pTexture must be created with USAGE_SPARSE");

        if (Bind.pRanges == nullptr)
            continue;

        const SparseTextureProperties& TexSparseProps = Bind.pTexture->GetSparseProperties();
        for (Uint32 r = 0; r < Bind.NumRanges; ++r)
        {
            const SparseTextureMemoryBindRange& Range     = Bind.pRanges[r];
            const Box&                          Region    = Range.Region;
            const MipLevelProperties            MipProps  = GetMipLevelProperties(Desc, Range.MipLevel);
            const Uint32                        MipWidth  = MipProps.StorageWidth;
            const Uint32                        MipHeight = MipProps.StorageHeight;
            const Uint32                        MipDepth  = MipProps.Depth;

            CHECK_BIND_SPARSE_ATTRIBS(Range.MipLevel < Desc.MipLevels,
                                      "pTextureBinds[", i, "].pRanges[", r, "].MipLevel (", Range.MipLevel,
                                      ") must be less than the mip level count (", Desc.MipLevels, ").");
            CHECK_BIND_SPARSE_ATTRIBS(Range.MipLevel <= TexSparseProps.FirstMipInTail,
                                      "pTextureBinds[", i, "].pRanges[", r, "].MipLevel (", Range.MipLevel,
                                      ") must not exceed the first mip in tail (", TexSparseProps.FirstMipInTail, ")");

            if (Range.MipLevel < TexSparseProps.FirstMipInTail)
            {
                CHECK_BIND_SPARSE_ATTRIBS(Range.OffsetInMipTail == 0,
                                          "pTextureBinds[", i, "].pRanges[", r, "].OffsetInMipTail must be zero when Range.MipLevel is not a tail mip");
                CHECK_BIND_SPARSE_ATTRIBS(Region.IsValid(),
                                          "pTextureBinds[", i, "].pRanges[", r, "].Region must be valid");
                CHECK_BIND_SPARSE_ATTRIBS(Region.MaxX <= MipWidth || Region.MaxX == AlignUp(MipWidth, TexSparseProps.TileSize[0]),
                                          "pTextureBinds[", i, "].pRanges[", r, "].Region.MaxX (", Region.MaxX, ") must not exceed the mip level width (", MipWidth, ")");
                CHECK_BIND_SPARSE_ATTRIBS(Region.MaxY <= MipHeight || Region.MaxY == AlignUp(MipHeight, TexSparseProps.TileSize[1]),
                                          "pTextureBinds[", i, "].pRanges[", r, "].Region.MaxY (", Region.MaxY, ") must not exceed the mip level height (", MipHeight, ")");
                CHECK_BIND_SPARSE_ATTRIBS(Region.MaxZ <= MipDepth || Region.MaxZ == AlignUp(MipDepth, TexSparseProps.TileSize[2]),
                                          "pTextureBinds[", i, "].pRanges[", r, "].Region.MaxZ (", Region.MaxZ, ") must not exceed the mip level depth (", MipDepth, ")");

                CHECK_BIND_SPARSE_ATTRIBS((Region.MinX % TexSparseProps.TileSize[0]) == 0,
                                          "pTextureBinds[", i, "].pRanges[", r, "].Region.MinX (", Region.MinX, ") must be a multiple of the tile width (", TexSparseProps.TileSize[0], ")");
                CHECK_BIND_SPARSE_ATTRIBS((Region.MinY % TexSparseProps.TileSize[1]) == 0,
                                          "pTextureBinds[", i, "].pRanges[", r, "].Region.MinY (", Region.MinY, ") must be a multiple of the tile height (", TexSparseProps.TileSize[1], ")");
                CHECK_BIND_SPARSE_ATTRIBS((Region.MinZ % TexSparseProps.TileSize[2]) == 0,
                                          "pTextureBinds[", i, "].pRanges[", r, "].Region.MinZ (", Region.MinZ, ") must be a multiple of the tile depth (", TexSparseProps.TileSize[2], ")");
                CHECK_BIND_SPARSE_ATTRIBS((Region.Width() % TexSparseProps.TileSize[0]) == 0 || Region.MaxX == MipWidth,
                                          "pTextureBinds[", i, "].pRanges[", r, "].Region width (", Region.Width(), ") must be a multiple of the tile width (", TexSparseProps.TileSize[0], ")");
                CHECK_BIND_SPARSE_ATTRIBS((Region.Height() % TexSparseProps.TileSize[1]) == 0 || Region.MaxY == MipHeight,
                                          "pTextureBinds[", i, "].pRanges[", r, "].Region height (", Region.Height(), ") must be multiple of the tile height (", TexSparseProps.TileSize[1], ")");
                CHECK_BIND_SPARSE_ATTRIBS((Region.Depth() % TexSparseProps.TileSize[2]) == 0 || Region.MaxZ == MipDepth,
                                          "pTextureBinds[", i, "].pRanges[", r, "].Region depth (", Region.Depth(), ") must be a multiple of the tile depth (", TexSparseProps.TileSize[2], ")");
            }
            else
            {
                CHECK_BIND_SPARSE_ATTRIBS(Region == Box{},
                                          "pTextureBinds[", i, "].pRanges[", r, "].Region must be default when Range.MipLevel is a tail mip");
                CHECK_BIND_SPARSE_ATTRIBS(Range.OffsetInMipTail + Range.MemorySize <= TexSparseProps.MipTailSize,
                                          "pTextureBinds[", i, "].pRanges[", r, "] specifies OffsetInMipTail (", Range.OffsetInMipTail,
                                          ") and MemorySize (", Range.MemorySize, ") that exceed the mip tail size (", TexSparseProps.MipTailSize, ")");
                CHECK_BIND_SPARSE_ATTRIBS(Range.OffsetInMipTail % TexSparseProps.BlockSize == 0,
                                          "pTextureBinds[", i, "].pRanges[", r, "].OffsetInMipTail (", Range.OffsetInMipTail,
                                          ") must be a multiple of the texture block size (", TexSparseProps.BlockSize, ")");

                if (TexSparseProps.Flags & SPARSE_TEXTURE_FLAG_SINGLE_MIPTAIL)
                {
                    CHECK_BIND_SPARSE_ATTRIBS(Range.ArraySlice == 0,
                                              "pTextureBinds[", i, "].pRanges[", r, "].ArraySlice (", Range.ArraySlice, ") must be 0 for a single mip tail");
                }

                if (IsMetal)
                {
                    CHECK_BIND_SPARSE_ATTRIBS(Range.OffsetInMipTail == 0 && (Range.MemorySize == 0 || Range.MemorySize == TexSparseProps.MipTailSize),
                                              "pTextureBinds[", i, "].pRanges[", r, "]: in Metal, mip tail must be bound in a single memory range: ",
                                              "OffsetInMipTail (", Range.OffsetInMipTail, ") must be zero and MemorySize (", Range.MemorySize,
                                              ") must be equal to the mip tail size (", TexSparseProps.MipTailSize, ") or zero");
                }
            }

            CHECK_BIND_SPARSE_ATTRIBS(Range.ArraySlice < Desc.GetArraySize(),
                                      "pTextureBinds[", i, "].pRanges[", r, "].ArraySlice (", Range.ArraySlice, ") must be less than the array size (", Desc.GetArraySize(), ")");

            // MemorySize can be zero
            CHECK_BIND_SPARSE_ATTRIBS(Range.MemorySize % TexSparseProps.BlockSize == 0,
                                      "pTextureBinds[", i, "].pRanges[", r, "].MemorySize (", Range.MemorySize,
                                      ") must be a multiple of the texture block size (", TexSparseProps.BlockSize, ")");

            // In Metal, MemorySize is not defined and not used
            if (!IsMetal)
            {
                if (Range.MemorySize != 0 && Range.MipLevel < TexSparseProps.FirstMipInTail)
                {
                    const uint3  TilesInBox = GetNumSparseTilesInBox(Region, TexSparseProps.TileSize);
                    const Uint32 NumBlocks  = TilesInBox.x * TilesInBox.y * TilesInBox.z;
                    CHECK_BIND_SPARSE_ATTRIBS(Uint64{NumBlocks} * Uint64{TexSparseProps.BlockSize} == Range.MemorySize,
                                              "pTextureBinds[", i, "].pRanges[", r, "].MemorySize (", Range.MemorySize, ") does not match the sparse memory blocks count (",
                                              NumBlocks, ") in the specified region");
                }

                // packed mip tail
                if (Range.MipLevel == TexSparseProps.FirstMipInTail)
                {
                    // MemorySize is used to specify how much block must be bound/unbound
                    CHECK_BIND_SPARSE_ATTRIBS(Range.MemorySize != 0,
                                              "pTextureBinds[", i, "].pRanges[", r, "].MemorySize must not be zero");
                }

                if (Range.pMemory != nullptr)
                {
                    CHECK_BIND_SPARSE_ATTRIBS(Range.pMemory->IsCompatible(Bind.pTexture),
                                              "pTextureBinds[", i, "].pRanges[", r, "].pMemory must be compatible with pTexture");

                    const Uint64 Capacity = Range.pMemory->GetCapacity();
                    CHECK_BIND_SPARSE_ATTRIBS(Range.MemoryOffset + Range.MemorySize <= Capacity,
                                              "pTextureBinds[", i, "].pRanges[", r, "] specifies MemoryOffset (", Range.MemoryOffset, ") and MemorySize (",
                                              Range.MemorySize, ") that exceed the memory capacity (", Capacity, ")");
                    // Can not check here because the final memory offset depends on the device memory object implementation
                    //CHECK_BIND_SPARSE_ATTRIBS(Range.MemoryOffset % BuffSparseProps.BlockSize == 0)

                    const Uint64 PageSize = Range.pMemory->GetDesc().PageSize;
                    CHECK_BIND_SPARSE_ATTRIBS((Range.MemoryOffset % PageSize) + Range.MemorySize <= PageSize,
                                              "pTextureBinds[", i, "].pRanges[", r, "] specifies MemoryOffset (", Range.MemoryOffset, ") and MemorySize (", Range.MemorySize,
                                              ") that don't fit into a single page. In Direct3D12 and Vulkan this will be an error");
                }
            }

            if (Range.pMemory == nullptr)
            {
                CHECK_BIND_SPARSE_ATTRIBS(Range.MemoryOffset == 0,
                                          "pTextureBinds[", i, "].pRanges[", r, "]: pMemory is null, but MemoryOffset is not zero");
            }
        }
    }
#endif // DILIGENT_DEVELOPMENT

    if (Attribs.NumWaitFences != 0)
    {
        CHECK_BIND_SPARSE_ATTRIBS(Attribs.ppWaitFences != nullptr, "ppWaitFences must not be null if NumWaitFences is not zero");
        CHECK_BIND_SPARSE_ATTRIBS(Attribs.pWaitFenceValues != nullptr, "pWaitFenceValues must not be null if NumWaitFences is not zero");

        if (Attribs.pWaitFenceValues != nullptr)
        {
            for (Uint32 i = 0; i < Attribs.NumWaitFences; ++i)
            {
                CHECK_BIND_SPARSE_ATTRIBS(Attribs.ppWaitFences[i] != nullptr, "ppWaitFences[", i, "] must not be null");
                CHECK_BIND_SPARSE_ATTRIBS(Attribs.ppWaitFences[i]->GetDesc().Type == FENCE_TYPE_GENERAL, "ppWaitFences[", i, "] must be GENERAL type");
            }
        }
    }

    if (Attribs.NumSignalFences != 0)
    {
        CHECK_BIND_SPARSE_ATTRIBS(Attribs.ppSignalFences != nullptr, "ppSignalFences must not be null if NumSignalFences is not zero");
        CHECK_BIND_SPARSE_ATTRIBS(Attribs.pSignalFenceValues != nullptr, "pSignalFenceValues must not be null if NumSignalFences is not zero");

        if (Attribs.pSignalFenceValues != nullptr)
        {
            for (Uint32 i = 0; i < Attribs.NumSignalFences; ++i)
            {
                CHECK_BIND_SPARSE_ATTRIBS(Attribs.ppSignalFences[i] != nullptr, "ppSignalFences[", i, "] must not be null");
                CHECK_BIND_SPARSE_ATTRIBS(Attribs.ppSignalFences[i]->GetDesc().Type == FENCE_TYPE_GENERAL, "ppSignalFences[", i, "] must be GENERAL type");
            }
        }
    }

#undef CHECK_BIND_SPARSE_ATTRIBS

    return true;
}